

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O2

spv_result_t spvtools::val::MemoryPass(ValidationState_t *_,Instruction *inst)

{
  CapabilitySet *pCVar1;
  ushort uVar2;
  uint16_t uVar3;
  pointer puVar4;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  StorageClass SVar18;
  uint uVar19;
  uint uVar20;
  AddressingModel AVar21;
  uint32_t uVar22;
  int32_t iVar23;
  spv_result_t sVar24;
  int iVar25;
  size_t i;
  char *pcVar26;
  Instruction *pIVar27;
  Instruction *pIVar28;
  Instruction *pIVar29;
  Instruction *pIVar30;
  Function *pFVar31;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint16_t uVar32;
  bool bVar33;
  bool bVar34;
  size_t index;
  bool bVar35;
  Op opcode;
  ulong uVar36;
  string *__return_storage_ptr__;
  long lVar37;
  string instr_name;
  char *local_268;
  anon_class_24_3_e757d3e0 ValidateType;
  uint64_t stride_value;
  uint32_t data_type;
  undefined8 local_218;
  undefined8 local_210;
  string errorVUID;
  spv_result_t local_38;
  
  uVar2 = (inst->inst_).opcode;
  opcode = (Op)uVar2;
  switch(uVar2) {
  case 0x3b:
switchD_00295c2e_caseD_1142:
    local_38 = anon_unknown_2::ValidateVariable(_,inst);
    break;
  case 0x3c:
  case 0x45:
    goto switchD_00295c2e_caseD_1145;
  case 0x3d:
    pIVar27 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if (pIVar27 == (Instruction *)0x0) {
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&errorVUID,"OpLoad Result Type <id> ");
      uVar22 = (inst->inst_).type_id;
      goto LAB_002968a0;
    }
    uVar19 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar29 = ValidationState_t::FindDef(_,uVar19);
    if (pIVar29 == (Instruction *)0x0) {
LAB_00296c6c:
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&errorVUID,"OpLoad Pointer <id> ");
LAB_00296ca2:
      ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar19);
      std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
      pcVar26 = " is not a logical pointer.";
LAB_00296cb9:
      std::operator<<((ostream *)&errorVUID,pcVar26);
LAB_00296cc9:
      std::__cxx11::string::_M_dispose();
      goto LAB_00296e79;
    }
    AVar21 = ValidationState_t::addressing_model(_);
    if (AVar21 == Logical) {
      bVar6 = (_->features_).variable_pointers;
      if ((bool)bVar6 == false) {
        iVar23 = spvOpcodeReturnsLogicalPointer((uint)(pIVar29->inst_).opcode);
        if (iVar23 == 0) goto LAB_00296c6c;
        bVar6 = (_->features_).variable_pointers;
      }
      if (((bVar6 & 1) != 0) &&
         (bVar17 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar29->inst_).opcode), !bVar17))
      goto LAB_00296c6c;
    }
    pIVar28 = ValidationState_t::FindDef(_,(pIVar29->inst_).type_id);
    if (pIVar28 == (Instruction *)0x0) {
LAB_002960e5:
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&errorVUID,"OpLoad type for pointer <id> ");
LAB_002965ff:
      ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar19);
      std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
      pcVar26 = " is not a pointer type.";
      goto LAB_00296cb9;
    }
    uVar32 = (pIVar28->inst_).opcode;
    if (uVar32 != 0x20) {
      if (uVar32 != 0x1141) goto LAB_002960e5;
LAB_00297279:
      if ((_->options_->before_hlsl_legalization == false) &&
         (bVar17 = ValidationState_t::ContainsRuntimeArray(_,(inst->inst_).type_id), bVar17)) {
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        pcVar26 = "Cannot load a runtime-sized array";
      }
      else {
        sVar24 = anon_unknown_2::CheckMemoryAccess(_,inst,3);
        if (sVar24 != SPV_SUCCESS) {
          return sVar24;
        }
        bVar17 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Shader);
        if (((!bVar17) ||
            (bVar17 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id),
            !bVar17)) ||
           ((uVar36 = (ulong)(pIVar27->inst_).opcode, uVar36 < 0x21 &&
            ((0x101e00000U >> (uVar36 & 0x3f) & 1) != 0)))) {
          ValidationState_t::RegisterQCOMImageProcessingTextureConsumer
                    (_,uVar19,inst,(Instruction *)0x0);
          goto switchD_00295c2e_caseD_1145;
        }
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        pcVar26 = "8- or 16-bit loads must be a scalar, vector or matrix type";
      }
      goto LAB_00296e67;
    }
    uVar20 = Instruction::GetOperandAs<unsigned_int>(pIVar28,2);
    pIVar28 = ValidationState_t::FindDef(_,uVar20);
    if ((pIVar28 != (Instruction *)0x0) &&
       ((pIVar27->inst_).result_id == (pIVar28->inst_).result_id)) goto LAB_00297279;
    ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
    std::operator<<((ostream *)&errorVUID,"OpLoad Result Type <id> ");
    ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,(inst->inst_).type_id);
    std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
    std::operator<<((ostream *)&errorVUID," does not match Pointer <id> ");
    uVar22 = (pIVar29->inst_).result_id;
LAB_002974d2:
    __return_storage_ptr__ = (string *)&ValidateType;
LAB_002974d7:
    ValidationState_t::getIdName_abi_cxx11_(__return_storage_ptr__,_,uVar22);
    std::operator<<((ostream *)&errorVUID,(string *)__return_storage_ptr__);
    pcVar26 = "s type.";
LAB_002974f4:
    std::operator<<((ostream *)&errorVUID,pcVar26);
    std::__cxx11::string::_M_dispose();
    goto LAB_00296b84;
  case 0x3e:
    uVar19 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar27 = ValidationState_t::FindDef(_,uVar19);
    if (pIVar27 == (Instruction *)0x0) {
LAB_0029697b:
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&errorVUID,"OpStore Pointer <id> ");
      ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar19);
      std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
      pcVar26 = " is not a logical pointer.";
    }
    else {
      AVar21 = ValidationState_t::addressing_model(_);
      if (AVar21 == Logical) {
        bVar6 = (_->features_).variable_pointers;
        if ((bool)bVar6 == false) {
          iVar23 = spvOpcodeReturnsLogicalPointer((uint)(pIVar27->inst_).opcode);
          if (iVar23 == 0) goto LAB_0029697b;
          bVar6 = (_->features_).variable_pointers;
        }
        if (((bVar6 & 1) != 0) &&
           (bVar17 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar27->inst_).opcode), !bVar17)
           ) goto LAB_0029697b;
      }
      pIVar29 = ValidationState_t::FindDef(_,(pIVar27->inst_).type_id);
      if (pIVar29 == (Instruction *)0x0) {
LAB_002968bc:
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&errorVUID,"OpStore type for pointer <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar19);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        pcVar26 = " is not a pointer type.";
      }
      else {
        uVar32 = (pIVar29->inst_).opcode;
        if (uVar32 == 0x20) {
          uVar20 = Instruction::GetOperandAs<unsigned_int>(pIVar29,2);
          pIVar28 = ValidationState_t::FindDef(_,uVar20);
          if ((pIVar28 != (Instruction *)0x0) && ((pIVar28->inst_).opcode != 0x13))
          goto LAB_00296dbd;
          ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)&errorVUID,"OpStore Pointer <id> ");
LAB_00296da1:
          ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar19);
          std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
          pcVar26 = "s type is void.";
        }
        else {
          if (uVar32 != 0x1141) goto LAB_002968bc;
          pIVar28 = (Instruction *)0x0;
LAB_00296dbd:
          bVar17 = ValidationState_t::GetPointerTypeInfo
                             (_,(pIVar29->inst_).result_id,&data_type,(StorageClass *)&stride_value)
          ;
          if (bVar17) {
            if (((uint)stride_value < 10) && ((0x203U >> ((uint)stride_value & 0x1f) & 1) != 0)) {
              ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
              std::operator<<((ostream *)&errorVUID,"OpStore Pointer <id> ");
              ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar19);
              std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
              pcVar26 = " storage class is read-only";
            }
            else {
              if ((uint)stride_value == 0x14db) {
                ValidationState_t::VkErrorID_abi_cxx11_(&errorVUID,_,0x125f,(char *)0x0);
                pFVar31 = ValidationState_t::function(_,inst->function_->id_);
                std::__cxx11::string::string((string *)&instr_name,(string *)&errorVUID);
                ValidateType.inst = (Instruction **)0x0;
                ValidateType._ = (ValidationState_t *)operator_new(0x20);
                (ValidateType._)->context_ = (spv_const_context)&(ValidateType._)->words_;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)instr_name._M_dataplus._M_p == &instr_name.field_2) {
                  (ValidateType._)->words_ =
                       (uint32_t *)
                       CONCAT71(instr_name.field_2._M_allocated_capacity._1_7_,
                                instr_name.field_2._M_local_buf[0]);
                  (ValidateType._)->num_words_ = instr_name.field_2._8_8_;
                }
                else {
                  (ValidateType._)->context_ = (spv_const_context)instr_name._M_dataplus._M_p;
                  (ValidateType._)->words_ =
                       (uint32_t *)
                       CONCAT71(instr_name.field_2._M_allocated_capacity._1_7_,
                                instr_name.field_2._M_local_buf[0]);
                }
                (ValidateType._)->options_ =
                     (spv_const_validator_options)instr_name._M_string_length;
                instr_name._M_string_length = 0;
                instr_name.field_2._M_local_buf[0] = '\0';
                ValidateType.instr_name =
                     (string *)
                     std::
                     _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_memory.cpp:1082:15)>
                     ::_M_manager;
                instr_name._M_dataplus._M_p = (pointer)&instr_name.field_2;
                std::__cxx11::
                list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
                ::push_back(&pFVar31->execution_model_limitations_,(value_type *)&ValidateType);
                if (ValidateType.instr_name != (string *)0x0) {
                  (*(code *)ValidateType.instr_name)(&ValidateType,&ValidateType,3);
                }
                std::__cxx11::string::_M_dispose();
                std::__cxx11::string::_M_dispose();
              }
              else if ((uint)stride_value == 0x14df) {
                ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                pcVar26 = "ShaderRecordBufferKHR Storage Class variables are read only";
                goto LAB_00296e67;
              }
              bVar17 = spvIsVulkanEnv(_->context_->target_env);
              if (((bVar17) && ((uint)stride_value == 2)) &&
                 (pIVar27 = ValidationState_t::TracePointer(_,pIVar27),
                 (pIVar27->inst_).opcode == 0x3b)) {
                uVar20 = Instruction::GetOperandAs<unsigned_int>(pIVar27,0);
                pIVar27 = ValidationState_t::FindDef(_,uVar20);
                uVar20 = Instruction::GetOperandAs<unsigned_int>(pIVar27,2);
                pIVar27 = ValidationState_t::FindDef(_,uVar20);
                if (((pIVar27->inst_).opcode & 0xfffe) == 0x1c) {
                  uVar20 = Instruction::GetOperandAs<unsigned_int>(pIVar27,1);
                  pIVar27 = ValidationState_t::FindDef(_,uVar20);
                }
                bVar17 = ValidationState_t::HasDecoration(_,(pIVar27->inst_).result_id,Block);
                if (bVar17) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                  ValidationState_t::VkErrorID_abi_cxx11_(&instr_name,_,0x1b0d,(char *)0x0);
                  std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
                  pcVar26 = "In the Vulkan environment, cannot store to Uniform Blocks";
                  goto LAB_00296b75;
                }
              }
              uVar20 = Instruction::GetOperandAs<unsigned_int>(inst,1);
              pIVar27 = ValidationState_t::FindDef(_,uVar20);
              if ((pIVar27 != (Instruction *)0x0) &&
                 (uVar22 = (pIVar27->inst_).type_id, uVar22 != 0)) {
                pIVar29 = ValidationState_t::FindDef(_,uVar22);
                if ((pIVar29 != (Instruction *)0x0) &&
                   (uVar32 = (pIVar29->inst_).opcode, uVar32 != 0x13)) {
                  if ((pIVar28 != (Instruction *)0x0) &&
                     ((pIVar28->inst_).result_id != (pIVar29->inst_).result_id)) {
                    if ((_->options_->relax_struct_store != true) ||
                       ((uVar32 != 0x1e || ((pIVar28->inst_).opcode != 0x1e)))) {
                      ValidationState_t::diag
                                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                      std::operator<<((ostream *)&errorVUID,"OpStore Pointer <id> ");
                      ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar19);
                      std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
                      std::operator<<((ostream *)&errorVUID,"s type does not match Object <id> ");
                      uVar22 = (pIVar27->inst_).result_id;
                      __return_storage_ptr__ = (string *)&data_type;
                      goto LAB_002974d7;
                    }
                    bVar17 = anon_unknown_2::AreLayoutCompatibleStructs(_,pIVar28,pIVar29);
                    if (!bVar17) {
                      ValidationState_t::diag
                                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                      std::operator<<((ostream *)&errorVUID,"OpStore Pointer <id> ");
                      ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar19);
                      std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
                      std::operator<<((ostream *)&errorVUID,"s layout does not match Object <id> ");
                      ValidationState_t::getIdName_abi_cxx11_
                                ((string *)&data_type,_,(pIVar27->inst_).result_id);
                      std::operator<<((ostream *)&errorVUID,(string *)&data_type);
                      pcVar26 = "s layout.";
                      goto LAB_002974f4;
                    }
                  }
                  sVar24 = anon_unknown_2::CheckMemoryAccess(_,inst,2);
                  if (sVar24 != SPV_SUCCESS) {
                    return sVar24;
                  }
                  bVar17 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Shader);
                  if (((bVar17) &&
                      (bVar17 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                                          (_,(inst->inst_).type_id), bVar17)) &&
                     ((uVar36 = (ulong)(pIVar29->inst_).opcode, 0x20 < uVar36 ||
                      ((0x101e00000U >> (uVar36 & 0x3f) & 1) == 0)))) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                    pcVar26 = "8- or 16-bit stores must be a scalar, vector or matrix type";
                    goto LAB_00296e67;
                  }
                  goto switchD_00295c2e_caseD_1145;
                }
                ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                std::operator<<((ostream *)&errorVUID,"OpStore Object <id> ");
                uVar19 = uVar20;
                goto LAB_00296da1;
              }
              ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
              std::operator<<((ostream *)&errorVUID,"OpStore Object <id> ");
              ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
              std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
              pcVar26 = " is not an object.";
            }
          }
          else {
            ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
            std::operator<<((ostream *)&errorVUID,"OpStore Pointer <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar19);
            std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
            pcVar26 = " is not pointer type";
          }
        }
      }
    }
    goto LAB_00296b75;
  case 0x3f:
  case 0x40:
    uVar22 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar27 = ValidationState_t::FindDef(_,uVar22);
    if (pIVar27 == (Instruction *)0x0) {
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&errorVUID,"Target operand <id> ");
    }
    else {
      uVar19 = Instruction::GetOperandAs<unsigned_int>(inst,1);
      pIVar29 = ValidationState_t::FindDef(_,uVar19);
      if (pIVar29 != (Instruction *)0x0) {
        pIVar27 = ValidationState_t::FindDef(_,(pIVar27->inst_).type_id);
        if ((pIVar27 == (Instruction *)0x0) ||
           ((uVar32 = (pIVar27->inst_).opcode, uVar32 != 0x20 && (uVar32 != 0x1141)))) {
          ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)&errorVUID,"Target operand <id> ");
        }
        else {
          pIVar29 = ValidationState_t::FindDef(_,(pIVar29->inst_).type_id);
          if ((pIVar29 != (Instruction *)0x0) &&
             ((uVar32 = (pIVar29->inst_).opcode, uVar32 == 0x20 || (uVar32 == 0x1141)))) {
            if ((inst->inst_).opcode == 0x3f) {
              if ((pIVar27->inst_).opcode == 0x20) {
                uVar20 = Instruction::GetOperandAs<unsigned_int>(pIVar27,2);
                pIVar28 = ValidationState_t::FindDef(_,uVar20);
                if ((pIVar28 != (Instruction *)0x0) && ((pIVar28->inst_).opcode != 0x13)) {
                  if (uVar32 == 0x20) goto LAB_002979ff;
LAB_00297c7b:
                  uVar22 = 2;
LAB_002982f6:
                  sVar24 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar22);
                  if (sVar24 != SPV_SUCCESS) {
                    return sVar24;
                  }
                  uVar2 = (inst->inst_).opcode;
                  if (1 < uVar2 - 0x3f) {
                    __assert_fail("inst->opcode() == spv::Op::OpCopyMemory || inst->opcode() == spv::Op::OpCopyMemorySized"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_memory.cpp"
                                  ,0x494,
                                  "spv_result_t spvtools::val::(anonymous namespace)::ValidateCopyMemoryMemoryAccess(ValidationState_t &, const Instruction *)"
                                 );
                  }
                  uVar19 = uVar2 == 0x3f ^ 3;
                  if ((ulong)uVar19 <
                      (ulong)((long)(inst->operands_).
                                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(inst->operands_).
                                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4)) {
                    sVar24 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar19);
                    if (sVar24 != SPV_SUCCESS) {
                      return sVar24;
                    }
                    uVar20 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)uVar19);
                    iVar25 = anon_unknown_2::MemoryAccessNumWords(uVar20);
                    uVar19 = iVar25 + uVar19;
                    if ((ulong)uVar19 <
                        (ulong)((long)(inst->operands_).
                                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(inst->operands_).
                                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4)) {
                      if ((_->features_).copy_memory_permits_two_memory_accesses == true) {
                        sVar24 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar19);
                        if (sVar24 != SPV_SUCCESS) {
                          return sVar24;
                        }
                        if ((uVar20 & 0x10) == 0) {
                          uVar19 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)uVar19);
                          if ((uVar19 & 8) == 0) goto LAB_0029849a;
                          ValidationState_t::diag
                                    ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
                          pcVar26 = "Source memory access must not include MakePointerAvailableKHR";
                        }
                        else {
                          ValidationState_t::diag
                                    ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
                          pcVar26 = "Target memory access must not include MakePointerVisibleKHR";
                        }
                      }
                      else {
                        ValidationState_t::diag
                                  ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
                        pcVar26 = spvOpcodeString((uint)(inst->inst_).opcode);
                        std::operator<<((ostream *)&errorVUID,pcVar26);
                        pcVar26 = " with two memory access operands requires SPIR-V 1.4 or later";
                      }
                      std::operator<<((ostream *)&errorVUID,pcVar26);
                      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&errorVUID);
                      if (local_38 != SPV_SUCCESS) {
                        return local_38;
                      }
                    }
                  }
LAB_0029849a:
                  if ((pIVar27->inst_).opcode == 0x20) {
                    do {
                      uVar19 = Instruction::GetOperandAs<unsigned_int>(pIVar27,2);
                      pIVar27 = ValidationState_t::FindDef(_,uVar19);
                    } while ((pIVar27->inst_).opcode == 0x20);
                    bVar17 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Shader);
                    if ((bVar17) &&
                       (bVar17 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                                           (_,(pIVar27->inst_).result_id), bVar17)) {
                      ValidationState_t::diag
                                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                      pcVar26 = "Cannot copy memory of objects containing 8- or 16-bit types";
                      goto LAB_00296e67;
                    }
                  }
                  goto switchD_00295c2e_caseD_1145;
                }
                ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                std::operator<<((ostream *)&errorVUID,"Target operand <id> ");
                uVar19 = uVar22;
              }
              else {
                if (uVar32 != 0x20) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                  pcVar26 = "One of Source or Target must be a typed pointer";
                  goto LAB_00296e67;
                }
                pIVar28 = (Instruction *)0x0;
LAB_002979ff:
                uVar20 = Instruction::GetOperandAs<unsigned_int>(pIVar29,2);
                pIVar29 = ValidationState_t::FindDef(_,uVar20);
                if ((pIVar29 != (Instruction *)0x0) && ((pIVar29->inst_).opcode != 0x13)) {
                  if ((pIVar28 == (Instruction *)0x0) ||
                     ((pIVar28->inst_).result_id == (pIVar29->inst_).result_id)) goto LAB_00297c7b;
                  ValidationState_t::diag
                            ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                  std::operator<<((ostream *)&errorVUID,"Target <id> ");
                  ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar19);
                  std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
                  std::operator<<((ostream *)&errorVUID,"s type does not match Source <id> ");
                  uVar22 = (pIVar29->inst_).result_id;
                  goto LAB_002974d2;
                }
                ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                std::operator<<((ostream *)&errorVUID,"Source operand <id> ");
              }
              ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar19);
              std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
              pcVar26 = " cannot be a void pointer.";
              goto LAB_00296b75;
            }
            uVar22 = Instruction::GetOperandAs<unsigned_int>(inst,2);
            pIVar28 = ValidationState_t::FindDef(_,uVar22);
            if (pIVar28 == (Instruction *)0x0) {
              ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
              pcVar26 = "Size operand <id> ";
              goto LAB_0029672e;
            }
            pIVar30 = ValidationState_t::FindDef(_,(pIVar28->inst_).type_id);
            bVar17 = ValidationState_t::IsIntScalarType(_,(pIVar30->inst_).result_id);
            if (bVar17) {
              uVar32 = (pIVar28->inst_).opcode;
              if (uVar32 == 0x2b) {
                if (((pIVar30->words_).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[3] != 1) ||
                   (-1 < (int)(pIVar28->words_).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish[-1])) {
                  bVar17 = true;
                  uVar36 = 3;
                  while (bVar17) {
                    puVar4 = (pIVar28->words_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start;
                    if ((ulong)((long)(pIVar28->words_).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 2
                               ) <= uVar36) goto LAB_0029738d;
                    bVar17 = puVar4[uVar36] == 0;
                    uVar36 = uVar36 + 1;
                  }
                  goto LAB_00297af3;
                }
                ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                std::operator<<((ostream *)&errorVUID,"Size operand <id> ");
                ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar22);
                std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
                pcVar26 = " cannot have the sign bit set to 1.";
              }
              else {
                if (uVar32 != 0x2e) {
LAB_00297af3:
                  pCVar1 = &_->module_capabilities_;
                  bVar17 = EnumSet<spv::Capability>::contains(pCVar1,Shader);
                  if ((bVar17) &&
                     (ValidationState_t::EvalInt32IfConst
                                ((tuple<bool,_bool,_unsigned_int> *)&errorVUID,_,uVar22),
                     (((uint)errorVUID._M_dataplus._M_p & 3) != 0 & errorVUID._M_dataplus._M_p._4_1_
                     ) == 1)) {
                    SVar18 = Instruction::GetOperandAs<spv::StorageClass>(pIVar29,1);
                    local_218 = CONCAT44(extraout_var,SVar18);
                    SVar18 = Instruction::GetOperandAs<spv::StorageClass>(pIVar27,1);
                    local_210 = CONCAT44(extraout_var_00,SVar18);
                    bVar7 = EnumSet<spv::Capability>::contains(pCVar1,Int8);
                    bVar8 = EnumSet<spv::Capability>::contains
                                      (pCVar1,UniformAndStorageBuffer8BitAccess);
                    bVar9 = EnumSet<spv::Capability>::contains(pCVar1,StorageBuffer8BitAccess);
                    bVar9 = bVar9 || bVar8;
                    bVar10 = EnumSet<spv::Capability>::contains(pCVar1,StoragePushConstant8);
                    bVar11 = EnumSet<spv::Capability>::contains
                                       (pCVar1,WorkgroupMemoryExplicitLayout8BitAccessKHR);
                    bVar12 = EnumSet<spv::Capability>::contains(pCVar1,Int16);
                    bVar13 = EnumSet<spv::Capability>::contains(pCVar1,StorageUniform16);
                    bVar17 = EnumSet<spv::Capability>::contains(pCVar1,StorageBuffer16BitAccess);
                    bVar33 = (bVar17 || bVar13) || bVar9;
                    bVar14 = EnumSet<spv::Capability>::contains(pCVar1,StoragePushConstant16);
                    bVar15 = EnumSet<spv::Capability>::contains(pCVar1,StorageInputOutput16);
                    bVar16 = EnumSet<spv::Capability>::contains
                                       (pCVar1,WorkgroupMemoryExplicitLayout16BitAccessKHR);
                    bVar17 = false;
                    bVar5 = false;
                    switch((int)local_218) {
                    case 1:
                    case 3:
                      bVar17 = bVar15;
                      bVar5 = false;
                      break;
                    case 2:
                      bVar17 = bVar8 || bVar13;
                      bVar5 = bVar8;
                      break;
                    case 4:
                      bVar17 = bVar16;
                      bVar5 = bVar11;
                      break;
                    case 5:
                    case 6:
                    case 7:
                    case 8:
                    case 10:
                    case 0xb:
                      break;
                    case 9:
                      bVar17 = bVar14 || bVar10;
                      bVar5 = bVar10;
                      break;
                    case 0xc:
                      bVar17 = bVar33;
                      bVar5 = bVar9;
                      break;
                    default:
                      bVar5 = false;
                    }
                    bVar34 = false;
                    bVar35 = false;
                    switch((int)local_210) {
                    case 2:
                      bVar34 = bVar8 || bVar13;
                      bVar35 = bVar8;
                      break;
                    case 3:
                      bVar34 = bVar15;
                      bVar35 = false;
                      break;
                    case 4:
                      bVar34 = bVar16;
                      bVar35 = bVar11;
                      break;
                    case 5:
                    case 6:
                    case 7:
                    case 8:
                    case 10:
                    case 0xb:
                      break;
                    case 9:
                      bVar34 = bVar14 || bVar10;
                      bVar35 = bVar10;
                      break;
                    case 0xc:
                      bVar34 = bVar33;
                      bVar35 = bVar9;
                      break;
                    default:
                      bVar34 = false;
                      bVar35 = false;
                    }
                    if ((bVar12 || (bVar17 & bVar34) != 0) || bVar7) {
                      if ((bVar7 || (bVar5 & bVar35) != 0) ||
                          ((uint)errorVUID._M_dataplus._M_p & 1) == 0) goto LAB_002982f4;
                      ValidationState_t::diag
                                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                      pcVar26 = "Size must be a multiple of 2";
                    }
                    else {
                      ValidationState_t::diag
                                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                      pcVar26 = "Size must be a multiple of 4";
                    }
                    goto LAB_00296e67;
                  }
LAB_002982f4:
                  uVar22 = 3;
                  goto LAB_002982f6;
                }
LAB_0029738d:
                ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                std::operator<<((ostream *)&errorVUID,"Size operand <id> ");
                ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar22);
                std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
                pcVar26 = " cannot be a constant zero.";
              }
              goto LAB_00296b75;
            }
            ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
            std::operator<<((ostream *)&errorVUID,"Size operand <id> ");
LAB_002977f2:
            ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar22);
            std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
            pcVar26 = " must be a scalar integer type.";
            goto LAB_00296b75;
          }
          ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)&errorVUID,"Source operand <id> ");
          uVar22 = uVar19;
        }
        ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar22);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        pcVar26 = " is not a pointer.";
        goto LAB_00296b75;
      }
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
      pcVar26 = "Source operand <id> ";
      uVar22 = uVar19;
LAB_0029672e:
      std::operator<<((ostream *)&errorVUID,pcVar26);
    }
LAB_002968a0:
    ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar22);
    std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
    pcVar26 = " is not defined.";
LAB_00296b75:
    std::operator<<((ostream *)&errorVUID,pcVar26);
LAB_00296b84:
    std::__cxx11::string::_M_dispose();
LAB_00296e79:
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&errorVUID);
    break;
  case 0x41:
  case 0x42:
  case 0x46:
switchD_00295c2e_caseD_1143:
    local_38 = anon_unknown_2::ValidateAccessChain(_,inst);
    break;
  case 0x43:
switchD_00295c2e_caseD_1147:
    AVar21 = ValidationState_t::addressing_model(_);
    if (((AVar21 == Logical) && ((inst->inst_).opcode == 0x43)) &&
       ((_->features_).variable_pointers == false)) {
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
      std::operator<<((ostream *)&errorVUID,"Generating variable pointers requires capability ");
      pcVar26 = "VariablePointers or VariablePointersStorageBuffer";
    }
    else {
      sVar24 = anon_unknown_2::ValidateAccessChain(_,inst);
      if (sVar24 != SPV_SUCCESS) {
        return sVar24;
      }
      bVar17 = spvOpcodeGeneratesUntypedPointer((uint)(inst->inst_).opcode);
      uVar19 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      pIVar27 = ValidationState_t::FindDef(_,uVar19);
      if (bVar17) {
        uVar22 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      }
      else {
        uVar22 = (pIVar27->inst_).type_id;
      }
      pIVar27 = ValidationState_t::FindDef(_,uVar22);
      SVar18 = Instruction::GetOperandAs<spv::StorageClass>(pIVar27,1);
      pCVar1 = &_->module_capabilities_;
      bVar5 = EnumSet<spv::Capability>::contains(pCVar1,Shader);
      if ((!bVar5) ||
         ((((StorageBuffer < SVar18 || ((0x1204U >> (SVar18 & 0x1f) & 1) == 0)) &&
           ((SVar18 != PhysicalStorageBuffer &&
            ((bVar5 = EnumSet<spv::Capability>::contains(pCVar1,WorkgroupMemoryExplicitLayoutKHR),
             SVar18 != Workgroup || (!bVar5)))))) ||
          (bVar5 = ValidationState_t::HasDecoration(_,(pIVar27->inst_).result_id,ArrayStride), bVar5
          )))) {
        bVar5 = spvIsVulkanEnv(_->context_->target_env);
        if (bVar5) {
          if (bVar17) {
            bVar17 = EnumSet<spv::Capability>::contains(pCVar1,UntypedPointersKHR);
          }
          else {
            bVar17 = false;
          }
          if (SVar18 != PhysicalStorageBuffer) {
            if (SVar18 == StorageBuffer) {
              if (bVar17 == false && (_->features_).variable_pointers == false) {
                ValidationState_t::diag
                          ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
                ValidationState_t::VkErrorID_abi_cxx11_(&instr_name,_,0x1de4,(char *)0x0);
                std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
                pcVar26 = 
                "OpPtrAccessChain Base operand pointing to StorageBuffer storage class must use VariablePointers or VariablePointersStorageBuffer capability"
                ;
                goto LAB_00296b75;
              }
            }
            else if (SVar18 == Workgroup) {
              bVar5 = EnumSet<spv::Capability>::contains(pCVar1,VariablePointers);
              if (bVar17 == false && !bVar5) {
                ValidationState_t::diag
                          ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
                ValidationState_t::VkErrorID_abi_cxx11_(&instr_name,_,0x1de3,(char *)0x0);
                std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
                pcVar26 = 
                "OpPtrAccessChain Base operand pointing to Workgroup storage class must use VariablePointers capability"
                ;
                goto LAB_00296b75;
              }
            }
            else if (bVar17 == false) {
              ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
              ValidationState_t::VkErrorID_abi_cxx11_(&instr_name,_,0x1de2,(char *)0x0);
              std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
              pcVar26 = 
              "OpPtrAccessChain Base operand must point to Workgroup, StorageBuffer, or PhysicalStorageBuffer storage class"
              ;
              goto LAB_00296b75;
            }
          }
        }
        goto switchD_00295c2e_caseD_1145;
      }
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar26 = "OpPtrAccessChain must have a Base whose type is decorated with ArrayStride";
    }
LAB_00296e67:
    std::operator<<((ostream *)&errorVUID,pcVar26);
    goto LAB_00296e79;
  case 0x44:
switchD_00295c2e_caseD_1149:
    pcVar26 = spvOpcodeString(opcode);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&errorVUID,pcVar26,(allocator<char> *)&ValidateType);
    std::operator+(&instr_name,"Op",&errorVUID);
    std::__cxx11::string::_M_dispose();
    pIVar27 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((((pIVar27->inst_).opcode != 0x15) ||
        (uVar19 = Instruction::GetOperandAs<unsigned_int>(pIVar27,1), uVar19 != 0x20)) ||
       (uVar19 = Instruction::GetOperandAs<unsigned_int>(pIVar27,2), uVar19 != 0)) {
LAB_00295e96:
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&errorVUID,"The Result Type of ");
      std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
      std::operator<<((ostream *)&errorVUID," <id> ");
      ValidationState_t::getIdName_abi_cxx11_((string *)&ValidateType,_,(inst->inst_).result_id);
      std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
      pcVar26 = " must be OpTypeInt with width 32 and signedness 0.";
      goto LAB_00295f00;
    }
    uVar32 = (inst->inst_).opcode;
    uVar22 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)(uVar32 == 0x1149) | 2);
    pIVar27 = ValidationState_t::FindDef(_,uVar22);
    uVar3 = (pIVar27->inst_).opcode;
    if (uVar32 != 0x1149) {
      if (uVar3 == 0x20) goto LAB_00296fc1;
LAB_002970a5:
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&errorVUID,"The Structure\'s type in ");
      std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
      std::operator<<((ostream *)&errorVUID," <id> ");
      ValidationState_t::getIdName_abi_cxx11_((string *)&ValidateType,_,(inst->inst_).result_id);
      std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
      pcVar26 = " must be a pointer to an OpTypeStruct.";
      goto LAB_00295f00;
    }
    pIVar27 = inst;
    if (uVar3 == 0x1141) {
LAB_00296fc1:
      uVar19 = Instruction::GetOperandAs<unsigned_int>(pIVar27,2);
      pIVar27 = ValidationState_t::FindDef(_,uVar19);
      if ((pIVar27->inst_).opcode != 0x1e) goto LAB_002970a5;
      lVar37 = (long)(pIVar27->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pIVar27->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
      uVar19 = Instruction::GetOperandAs<unsigned_int>(pIVar27,lVar37 - 1);
      pIVar27 = ValidationState_t::FindDef(_,uVar19);
      if ((pIVar27->inst_).opcode != 0x1d) {
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&errorVUID,"The Structure\'s last member in ");
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        std::operator<<((ostream *)&errorVUID," <id> ");
        ValidationState_t::getIdName_abi_cxx11_((string *)&ValidateType,_,(inst->inst_).result_id);
        std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
        pcVar26 = " must be an OpTypeRuntimeArray.";
LAB_00295f00:
        std::operator<<((ostream *)&errorVUID,pcVar26);
LAB_00295f08:
        std::__cxx11::string::_M_dispose();
        goto LAB_00295f1a;
      }
      uVar19 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)(uVar32 == 0x1149) + 3);
      sVar24 = SPV_SUCCESS;
      if (lVar37 - 2U != (ulong)uVar19) {
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&errorVUID,"The array member in ");
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        std::operator<<((ostream *)&errorVUID," <id> ");
        ValidationState_t::getIdName_abi_cxx11_((string *)&ValidateType,_,(inst->inst_).result_id);
        std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
        pcVar26 = " must be the last member of the struct.";
        goto LAB_00295f00;
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&errorVUID,"Pointer must be an untyped pointer");
LAB_00295f1a:
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&errorVUID);
      sVar24 = local_38;
    }
LAB_00295f1f:
    std::__cxx11::string::_M_dispose();
    local_38 = sVar24;
    break;
  default:
    switch(uVar2) {
    case 0x1142:
      goto switchD_00295c2e_caseD_1142;
    case 0x1143:
    case 0x1144:
      goto switchD_00295c2e_caseD_1143;
    case 0x1145:
    case 0x1146:
      goto switchD_00295c2e_caseD_1145;
    case 0x1147:
    case 0x1148:
      goto switchD_00295c2e_caseD_1147;
    case 0x1149:
      goto switchD_00295c2e_caseD_1149;
    default:
      if (uVar2 - 0x191 < 3) {
        AVar21 = ValidationState_t::addressing_model(_);
        if ((AVar21 == Logical) && ((_->features_).variable_pointers == false)) {
          ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
          pcVar26 = 
          "Instruction cannot for logical addressing model be used without a variable pointers capability"
          ;
        }
        else {
          pIVar27 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
          if ((inst->inst_).opcode == 0x193) {
            if ((pIVar27 == (Instruction *)0x0) || ((pIVar27->inst_).opcode != 0x15)) {
              ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
              pcVar26 = "Result Type must be an integer scalar";
            }
            else {
LAB_00295f42:
              uVar19 = Instruction::GetOperandAs<unsigned_int>(inst,2);
              pIVar27 = ValidationState_t::FindDef(_,uVar19);
              uVar19 = Instruction::GetOperandAs<unsigned_int>(inst,3);
              pIVar29 = ValidationState_t::FindDef(_,uVar19);
              if ((pIVar29 == (Instruction *)0x0 || pIVar27 == (Instruction *)0x0) ||
                 (uVar22 = (pIVar27->inst_).type_id, uVar22 != (pIVar29->inst_).type_id)) {
                ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                pcVar26 = "The types of Operand 1 and Operand 2 must match";
              }
              else {
                pIVar27 = ValidationState_t::FindDef(_,uVar22);
                if ((pIVar27 == (Instruction *)0x0) ||
                   ((uVar32 = (pIVar27->inst_).opcode, uVar32 != 0x20 && (uVar32 != 0x1141)))) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                  pcVar26 = "Operand type must be a pointer";
                }
                else {
                  SVar18 = Instruction::GetOperandAs<spv::StorageClass>(pIVar27,1);
                  AVar21 = ValidationState_t::addressing_model(_);
                  if (AVar21 == Logical) {
                    if ((SVar18 & ~Generic) == Workgroup) {
                      if ((SVar18 != Workgroup) ||
                         (bVar17 = EnumSet<spv::Capability>::contains
                                             (&_->module_capabilities_,VariablePointers), bVar17))
                      goto switchD_00295c2e_caseD_1145;
                      ValidationState_t::diag
                                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                      pcVar26 = 
                      "Workgroup storage class pointer requires VariablePointers capability to be specified"
                      ;
                    }
                    else {
                      ValidationState_t::diag
                                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                      pcVar26 = "Invalid pointer storage class";
                    }
                  }
                  else {
                    if (SVar18 != PhysicalStorageBuffer) goto switchD_00295c2e_caseD_1145;
                    ValidationState_t::diag
                              ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                    pcVar26 = "Cannot use a pointer in the PhysicalStorageBuffer storage class";
                  }
                }
              }
            }
          }
          else {
            if ((pIVar27 != (Instruction *)0x0) && ((pIVar27->inst_).opcode == 0x14))
            goto LAB_00295f42;
            ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
            pcVar26 = "Result Type must be OpTypeBool";
          }
        }
        goto LAB_00296e67;
      }
      if (uVar2 == 0x1169) {
        local_268 = "spv::Op::OpCooperativeMatrixLoadKHR";
        pIVar27 = inst;
LAB_0029635e:
        uVar22 = (pIVar27->inst_).type_id;
        pIVar27 = ValidationState_t::FindDef(_,uVar22);
        uVar32 = (inst->inst_).opcode;
        if ((pIVar27->inst_).opcode != 0x1168) {
          if (uVar32 == 0x1169) {
            ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
            pcVar26 = "spv::Op::OpCooperativeMatrixLoadKHR Result Type <id> ";
          }
          else {
            ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
            pcVar26 = "spv::Op::OpCooperativeMatrixStoreKHR Object type <id> ";
          }
LAB_00296838:
          std::operator<<((ostream *)&errorVUID,pcVar26);
          ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar22);
          std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
          pcVar26 = " is not a cooperative matrix type.";
          goto LAB_00296b75;
        }
        uVar19 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)((uint)(uVar32 == 0x1169) * 2))
        ;
        pIVar27 = ValidationState_t::FindDef(_,uVar19);
        if (pIVar27 == (Instruction *)0x0) {
LAB_00296a67:
          ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)&errorVUID,local_268);
          std::operator<<((ostream *)&errorVUID," Pointer <id> ");
          goto LAB_00296ca2;
        }
        AVar21 = ValidationState_t::addressing_model(_);
        if (AVar21 == Logical) {
          bVar6 = (_->features_).variable_pointers;
          if ((bool)bVar6 == false) {
            iVar23 = spvOpcodeReturnsLogicalPointer((uint)(pIVar27->inst_).opcode);
            if (iVar23 == 0) goto LAB_00296a67;
            bVar6 = (_->features_).variable_pointers;
          }
          if (((bVar6 & 1) != 0) &&
             (bVar17 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar27->inst_).opcode),
             !bVar17)) goto LAB_00296a67;
        }
        uVar22 = (pIVar27->inst_).type_id;
        pIVar29 = ValidationState_t::FindDef(_,uVar22);
        if ((pIVar29 == (Instruction *)0x0) ||
           ((uVar32 = (pIVar29->inst_).opcode, uVar32 != 0x20 && (uVar32 != 0x1141)))) {
LAB_002965bd:
          ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)&errorVUID,local_268);
          std::operator<<((ostream *)&errorVUID," type for pointer <id> ");
          goto LAB_002965ff;
        }
        SVar18 = Instruction::GetOperandAs<spv::StorageClass>(pIVar29,1);
        if ((SVar18 != Workgroup) &&
           ((SVar18 != StorageBuffer && (SVar18 != PhysicalStorageBuffer)))) {
          ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
          ValidationState_t::VkErrorID_abi_cxx11_(&instr_name,_,0x230d,(char *)0x0);
          std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
          std::operator<<((ostream *)&errorVUID,local_268);
          std::operator<<((ostream *)&errorVUID," storage class for pointer type <id> ");
          ValidationState_t::getIdName_abi_cxx11_((string *)&ValidateType,_,uVar22);
          std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
          std::operator<<((ostream *)&errorVUID,
                          " is not Workgroup, StorageBuffer, or PhysicalStorageBuffer.");
          std::__cxx11::string::_M_dispose();
          goto LAB_00296cc9;
        }
        if (uVar32 == 0x1141) {
LAB_0029645a:
          uVar19 = Instruction::GetOperandAs<unsigned_int>
                             (inst,(ulong)((inst->inst_).opcode == 0x1169) | 2);
          pIVar27 = ValidationState_t::FindDef(_,uVar19);
          if ((pIVar27 == (Instruction *)0x0) ||
             ((bVar17 = ValidationState_t::IsIntScalarType(_,(pIVar27->inst_).type_id), !bVar17 ||
              (iVar23 = spvOpcodeIsConstant((uint)(pIVar27->inst_).opcode), iVar23 == 0)))) {
            ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
            std::operator<<((ostream *)&errorVUID,"MemoryLayout operand <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar19);
            std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
            pcVar26 = " must be a 32-bit integer constant instruction.";
            goto LAB_00296b75;
          }
          bVar17 = ValidationState_t::EvalConstantValUint64(_,uVar19,(uint64_t *)&ValidateType);
          uVar32 = (inst->inst_).opcode;
          index = (ulong)(uVar32 == 0x1169) + 3;
          uVar36 = (long)(inst->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(inst->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4;
          if (index < uVar36) {
            uVar22 = Instruction::GetOperandAs<unsigned_int>(inst,index);
            pIVar27 = ValidationState_t::FindDef(_,uVar22);
            if ((pIVar27 == (Instruction *)0x0) ||
               (bVar17 = ValidationState_t::IsIntScalarType(_,(pIVar27->inst_).type_id), !bVar17)) {
LAB_00297510:
              ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
              std::operator<<((ostream *)&errorVUID,"Stride operand <id> ");
              goto LAB_002977f2;
            }
            uVar32 = (inst->inst_).opcode;
            uVar36 = (long)(inst->operands_).
                           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(inst->operands_).
                           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4;
          }
          else if (bVar17 && ValidateType._ < (ValidationState_t *)0x2) {
            ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
            std::operator<<((ostream *)&errorVUID,"MemoryLayout ");
            std::ostream::_M_insert<unsigned_long>((ulong)&errorVUID);
            pcVar26 = " requires a Stride.";
            goto LAB_00296e67;
          }
          uVar19 = uVar32 == 0x1169 | 4;
          if ((uVar36 <= uVar19) ||
             (local_38 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar19), local_38 == SPV_SUCCESS))
          {
            local_38 = SPV_SUCCESS;
          }
          break;
        }
        uVar19 = Instruction::GetOperandAs<unsigned_int>(pIVar29,2);
        pIVar29 = ValidationState_t::FindDef(_,uVar19);
        if ((pIVar29 != (Instruction *)0x0) &&
           ((bVar17 = ValidationState_t::IsIntScalarOrVectorType(_,uVar19), bVar17 ||
            (bVar17 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar19), bVar17))))
        goto LAB_0029645a;
LAB_00296e98:
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&errorVUID,local_268);
        std::operator<<((ostream *)&errorVUID," Pointer <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,(pIVar27->inst_).result_id);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        std::operator<<((ostream *)&errorVUID,"s Type must be a scalar or vector type.");
        std::__cxx11::string::_M_dispose();
        goto LAB_00296e79;
      }
      if (uVar2 == 0x116a) {
        uVar19 = Instruction::GetOperandAs<unsigned_int>(inst,1);
        pIVar27 = ValidationState_t::FindDef(_,uVar19);
        local_268 = "spv::Op::OpCooperativeMatrixStoreKHR";
        goto LAB_0029635e;
      }
      if (uVar2 == 0x116c) {
LAB_00295e24:
        pcVar26 = spvOpcodeString(opcode);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&errorVUID,pcVar26,(allocator<char> *)&ValidateType);
        std::operator+(&instr_name,"Op",&errorVUID);
        std::__cxx11::string::_M_dispose();
        pIVar27 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
        if ((((pIVar27->inst_).opcode == 0x15) &&
            (uVar19 = Instruction::GetOperandAs<unsigned_int>(pIVar27,1), uVar19 == 0x20)) &&
           (uVar19 = Instruction::GetOperandAs<unsigned_int>(pIVar27,2), uVar19 == 0)) {
          uVar32 = (inst->inst_).opcode;
          uVar19 = Instruction::GetOperandAs<unsigned_int>(inst,2);
          pIVar27 = ValidationState_t::FindDef(_,uVar19);
          uVar3 = (pIVar27->inst_).opcode;
          if (uVar32 == 0x116c) {
            if (uVar3 == 0x1168) {
LAB_0029716f:
              sVar24 = SPV_SUCCESS;
              goto LAB_00295f1f;
            }
            ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
            std::operator<<((ostream *)&errorVUID,"The type in ");
            std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
            std::operator<<((ostream *)&errorVUID," <id> ");
            ValidationState_t::getIdName_abi_cxx11_((string *)&ValidateType,_,uVar19);
            std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
            pcVar26 = " must be OpTypeCooperativeMatrixKHR.";
          }
          else {
            if (uVar3 == 0x14ee) goto LAB_0029716f;
            ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
            std::operator<<((ostream *)&errorVUID,"The type in ");
            std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
            std::operator<<((ostream *)&errorVUID," <id> ");
            ValidationState_t::getIdName_abi_cxx11_((string *)&ValidateType,_,uVar19);
            std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
            pcVar26 = " must be OpTypeCooperativeMatrixNV.";
          }
          goto LAB_00295f00;
        }
        goto LAB_00295e96;
      }
      if (uVar2 != 0x14ef) {
        if (uVar2 == 0x14f0) {
          uVar19 = Instruction::GetOperandAs<unsigned_int>(inst,1);
          pIVar27 = ValidationState_t::FindDef(_,uVar19);
          local_268 = "spv::Op::OpCooperativeMatrixStoreNV";
          goto LAB_00296148;
        }
        if (uVar2 == 0x14f2) goto LAB_00295e24;
        if (opcode != OpRawAccessChainNV) goto switchD_00295c2e_caseD_1145;
        _data_type = (pointer)inst;
        pcVar26 = spvOpcodeString(OpRawAccessChainNV);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&errorVUID,pcVar26,(allocator<char> *)&ValidateType);
        std::operator+(&instr_name,"Op",&errorVUID);
        std::__cxx11::string::_M_dispose();
        pIVar27 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
        if ((pIVar27->inst_).opcode == 0x20) {
          SVar18 = Instruction::GetOperandAs<spv::StorageClass>(pIVar27,1);
          if (((SVar18 != Uniform) && (SVar18 != StorageBuffer)) &&
             (SVar18 != PhysicalStorageBuffer)) {
            ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
            std::operator<<((ostream *)&errorVUID,"The Result Type of ");
            std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
            std::operator<<((ostream *)&errorVUID," <id> ");
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)&ValidateType,_,(inst->inst_).result_id);
            std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
            pcVar26 = 
            " must point to a storage class of StorageBuffer, PhysicalStorageBuffer, or Uniform.";
            goto LAB_00295f00;
          }
          uVar19 = Instruction::GetOperandAs<unsigned_int>(pIVar27,2);
          pIVar27 = ValidationState_t::FindDef(_,uVar19);
          uVar19 = (uint)(pIVar27->inst_).opcode;
          if ((uVar19 < 0x1f) && ((0x51000000U >> (uVar19 & 0x1f) & 1) != 0)) {
            ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
            std::operator<<((ostream *)&errorVUID,"The Result Type of ");
            std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
            std::operator<<((ostream *)&errorVUID," <id> ");
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)&ValidateType,_,(inst->inst_).result_id);
            std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
            pcVar26 = " must not point to OpTypeArray, OpTypeMatrix, or OpTypeStruct.";
            goto LAB_00295f00;
          }
          uVar19 = Instruction::GetOperandAs<unsigned_int>(inst,3);
          pIVar27 = ValidationState_t::FindDef(_,uVar19);
          if ((pIVar27->inst_).opcode != 0x2b) {
            ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
            std::operator<<((ostream *)&errorVUID,"The Stride of ");
            std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
            std::operator<<((ostream *)&errorVUID," <id> ");
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)&ValidateType,_,(inst->inst_).result_id);
            std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
            pcVar26 = " must be OpConstant. Found Op";
            goto LAB_002967fe;
          }
          pIVar29 = ValidationState_t::FindDef(_,(pIVar27->inst_).type_id);
          if ((pIVar29->inst_).opcode != 0x15) {
            ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
            std::operator<<((ostream *)&errorVUID,"The type of Stride of ");
            std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
            std::operator<<((ostream *)&errorVUID," <id> ");
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)&ValidateType,_,(inst->inst_).result_id);
            std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
            std::operator<<((ostream *)&errorVUID," must be OpTypeInt. Found Op");
            uVar2 = (pIVar29->inst_).opcode;
            goto LAB_0029680c;
          }
          ValidateType.inst = (Instruction **)&data_type;
          ValidateType._ = _;
          ValidateType.instr_name = &instr_name;
          sVar24 = anon_unknown_2::ValidateRawAccessChain::anon_class_24_3_e757d3e0::operator()
                             (&ValidateType,"Index",4);
          if ((sVar24 == SPV_SUCCESS) &&
             (sVar24 = anon_unknown_2::ValidateRawAccessChain::anon_class_24_3_e757d3e0::operator()
                                 (&ValidateType,"Offset",5), sVar24 == SPV_SUCCESS)) {
            sVar24 = SPV_SUCCESS;
            if ((ulong)((long)*(pointer *)(_data_type + 0x20) -
                       (long)(((vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                *)(_data_type + 0x18))->
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             )._M_impl.super__Vector_impl_data._M_start) < 0x61) goto LAB_00295f1f;
            uVar19 = Instruction::GetOperandAs<unsigned_int>((Instruction *)_data_type,6);
            if ((uVar19 & 2) == 0) {
LAB_0029806f:
              if ((uVar19 & 1) == 0) {
                if ((SVar18 == PhysicalStorageBuffer & (byte)((uVar19 & 2) >> 1)) != 0) {
LAB_002981e6:
                  ValidationState_t::diag
                            ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,
                             (Instruction *)_data_type);
                  pcVar26 = 
                  "Storage class cannot be PhysicalStorageBuffer when raw access chain robustness is used."
                  ;
                  goto LAB_00298208;
                }
              }
              else {
                if (SVar18 == PhysicalStorageBuffer) goto LAB_002981e6;
                sVar24 = SPV_SUCCESS;
                if ((uVar19 & 2) != 0) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,
                             (Instruction *)_data_type);
                  pcVar26 = 
                  "Per-component robustness and per-element robustness are mutually exclusive.";
                  goto LAB_00298208;
                }
              }
              goto LAB_00295f1f;
            }
            stride_value = 0;
            bVar17 = ValidationState_t::EvalConstantValUint64
                               (_,(pIVar27->inst_).result_id,&stride_value);
            if ((!bVar17) || (stride_value != 0)) goto LAB_0029806f;
            ValidationState_t::diag
                      ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,
                       (Instruction *)_data_type);
            pcVar26 = "Stride must not be zero when per-element robustness is used.";
LAB_00298208:
            std::operator<<((ostream *)&errorVUID,pcVar26);
            goto LAB_00295f1a;
          }
          goto LAB_00295f1f;
        }
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)&errorVUID,"The Result Type of ");
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        std::operator<<((ostream *)&errorVUID," <id> ");
        ValidationState_t::getIdName_abi_cxx11_((string *)&ValidateType,_,(inst->inst_).result_id);
        std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
        pcVar26 = " must be OpTypePointer. Found Op";
LAB_002967fe:
        std::operator<<((ostream *)&errorVUID,pcVar26);
        uVar2 = (pIVar27->inst_).opcode;
LAB_0029680c:
        pcVar26 = spvOpcodeString((uint)uVar2);
        std::operator<<((ostream *)&errorVUID,pcVar26);
        std::operator<<((ostream *)&errorVUID,'.');
        goto LAB_00295f08;
      }
      local_268 = "spv::Op::OpCooperativeMatrixLoadNV";
      pIVar27 = inst;
LAB_00296148:
      uVar22 = (pIVar27->inst_).type_id;
      pIVar27 = ValidationState_t::FindDef(_,uVar22);
      uVar32 = (inst->inst_).opcode;
      if ((pIVar27->inst_).opcode != 0x14ee) {
        if (uVar32 == 0x14ef) {
          ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
          pcVar26 = "spv::Op::OpCooperativeMatrixLoadNV Result Type <id> ";
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
          pcVar26 = "spv::Op::OpCooperativeMatrixStoreNV Object type <id> ";
        }
        goto LAB_00296838;
      }
      uVar19 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)((uint)(uVar32 == 0x14ef) * 2));
      pIVar27 = ValidationState_t::FindDef(_,uVar19);
      if (pIVar27 == (Instruction *)0x0) goto LAB_00296a67;
      AVar21 = ValidationState_t::addressing_model(_);
      if (AVar21 == Logical) {
        bVar6 = (_->features_).variable_pointers;
        if ((bool)bVar6 == false) {
          iVar23 = spvOpcodeReturnsLogicalPointer((uint)(pIVar27->inst_).opcode);
          if (iVar23 == 0) goto LAB_00296a67;
          bVar6 = (_->features_).variable_pointers;
        }
        if (((bVar6 & 1) != 0) &&
           (bVar17 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar27->inst_).opcode), !bVar17)
           ) goto LAB_00296a67;
      }
      uVar22 = (pIVar27->inst_).type_id;
      pIVar29 = ValidationState_t::FindDef(_,uVar22);
      if ((pIVar29 == (Instruction *)0x0) || ((pIVar29->inst_).opcode != 0x20)) goto LAB_002965bd;
      SVar18 = Instruction::GetOperandAs<spv::StorageClass>(pIVar29,1);
      if (((SVar18 != Workgroup) && (SVar18 != StorageBuffer)) && (SVar18 != PhysicalStorageBuffer))
      {
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&errorVUID,local_268);
        std::operator<<((ostream *)&errorVUID," storage class for pointer type <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar22);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        pcVar26 = " is not Workgroup or StorageBuffer.";
        goto LAB_00296cb9;
      }
      uVar19 = Instruction::GetOperandAs<unsigned_int>(pIVar29,2);
      pIVar29 = ValidationState_t::FindDef(_,uVar19);
      if ((pIVar29 == (Instruction *)0x0) ||
         ((bVar17 = ValidationState_t::IsIntScalarOrVectorType(_,uVar19), !bVar17 &&
          (bVar17 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar19), !bVar17))))
      goto LAB_00296e98;
      uVar22 = Instruction::GetOperandAs<unsigned_int>
                         (inst,(ulong)((inst->inst_).opcode == 0x14ef) | 2);
      pIVar27 = ValidationState_t::FindDef(_,uVar22);
      if ((pIVar27 == (Instruction *)0x0) ||
         (bVar17 = ValidationState_t::IsIntScalarType(_,(pIVar27->inst_).type_id), !bVar17))
      goto LAB_00297510;
      uVar19 = Instruction::GetOperandAs<unsigned_int>
                         (inst,(ulong)((inst->inst_).opcode == 0x14ef) + 3);
      pIVar27 = ValidationState_t::FindDef(_,uVar19);
      if (((pIVar27 == (Instruction *)0x0) ||
          (bVar17 = ValidationState_t::IsBoolScalarType(_,(pIVar27->inst_).type_id), !bVar17)) ||
         ((iVar23 = spvOpcodeIsConstant((uint)(pIVar27->inst_).opcode), iVar23 == 0 &&
          (iVar23 = spvOpcodeIsSpecConstant((uint)(pIVar27->inst_).opcode), iVar23 == 0)))) {
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&errorVUID,"Column Major operand <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar19);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        pcVar26 = " must be a boolean constant instruction.";
        goto LAB_00296b75;
      }
      uVar19 = (inst->inst_).opcode == 0x14ef | 4;
      if ((ulong)((long)(inst->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(inst->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) <= (ulong)uVar19)
      goto switchD_00295c2e_caseD_1145;
      local_38 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar19);
      break;
    }
  }
  if (local_38 == SPV_SUCCESS) {
switchD_00295c2e_caseD_1145:
    local_38 = SPV_SUCCESS;
  }
  return local_38;
}

Assistant:

spv_result_t MemoryPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpVariable:
    case spv::Op::OpUntypedVariableKHR:
      if (auto error = ValidateVariable(_, inst)) return error;
      break;
    case spv::Op::OpLoad:
      if (auto error = ValidateLoad(_, inst)) return error;
      break;
    case spv::Op::OpStore:
      if (auto error = ValidateStore(_, inst)) return error;
      break;
    case spv::Op::OpCopyMemory:
    case spv::Op::OpCopyMemorySized:
      if (auto error = ValidateCopyMemory(_, inst)) return error;
      break;
    case spv::Op::OpPtrAccessChain:
    case spv::Op::OpUntypedPtrAccessChainKHR:
    case spv::Op::OpUntypedInBoundsPtrAccessChainKHR:
      if (auto error = ValidatePtrAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpAccessChain:
    case spv::Op::OpInBoundsAccessChain:
    case spv::Op::OpInBoundsPtrAccessChain:
    case spv::Op::OpUntypedAccessChainKHR:
    case spv::Op::OpUntypedInBoundsAccessChainKHR:
      if (auto error = ValidateAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpRawAccessChainNV:
      if (auto error = ValidateRawAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpArrayLength:
    case spv::Op::OpUntypedArrayLengthKHR:
      if (auto error = ValidateArrayLength(_, inst)) return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadNV:
    case spv::Op::OpCooperativeMatrixStoreNV:
      if (auto error = ValidateCooperativeMatrixLoadStoreNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeMatrixLengthKHR:
    case spv::Op::OpCooperativeMatrixLengthNV:
      if (auto error = ValidateCooperativeMatrixLengthNV(_, inst)) return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadKHR:
    case spv::Op::OpCooperativeMatrixStoreKHR:
      if (auto error = ValidateCooperativeMatrixLoadStoreKHR(_, inst))
        return error;
      break;
    case spv::Op::OpPtrEqual:
    case spv::Op::OpPtrNotEqual:
    case spv::Op::OpPtrDiff:
      if (auto error = ValidatePtrComparison(_, inst)) return error;
      break;
    case spv::Op::OpImageTexelPointer:
    case spv::Op::OpGenericPtrMemSemantics:
    default:
      break;
  }

  return SPV_SUCCESS;
}